

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * __thiscall google::protobuf::io::EpsCopyOutputStream::Next(EpsCopyOutputStream *this)

{
  undefined8 uVar1;
  int iVar2;
  uint8_t *puVar3;
  LogMessage *pLVar4;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  LogMessageFatal local_88 [23];
  Voidify local_71;
  EpsCopyOutputStream *local_70;
  void *data;
  EpsCopyOutputStream *pEStack_60;
  int size;
  uint8_t *ptr;
  byte local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  EpsCopyOutputStream *local_18;
  EpsCopyOutputStream *this_local;
  
  local_41 = 0;
  local_18 = this;
  if ((this->had_error_ & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,"!had_error_");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,0x34c,local_40._M_len,local_40._M_str);
    local_41 = 1;
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar4);
  }
  if ((local_41 & 1) == 0) {
    if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
      this_local = (EpsCopyOutputStream *)Error(this);
    }
    else if (this->buffer_end_ == (uint8_t *)0x0) {
      *(undefined8 *)this->buffer_ = *(undefined8 *)this->end_;
      *(undefined8 *)(this->buffer_ + 8) = *(undefined8 *)(this->end_ + 8);
      this->buffer_end_ = this->end_;
      this->end_ = this->buffer_ + 0x10;
      this_local = (EpsCopyOutputStream *)this->buffer_;
    }
    else {
      memcpy(this->buffer_end_,this->buffer_,(long)this->end_ - (long)this->buffer_);
      do {
        iVar2 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])
                          (this->stream_,&local_70,(long)&data + 4);
        if ((((byte)iVar2 ^ 0xff) & 1) != 0) {
          puVar3 = Error(this);
          return puVar3;
        }
        pEStack_60 = local_70;
      } while (data._4_4_ == 0);
      if (data._4_4_ < 0x11) {
        if (data._4_4_ < 1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_98,"size > 0");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_88,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
                     ,0x362,local_98._M_len,local_98._M_str);
          pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                             ((LogMessage *)local_88);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_71,pLVar4);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_88);
        }
        uVar1 = *(undefined8 *)(this->end_ + 8);
        *(undefined8 *)this->buffer_ = *(undefined8 *)this->end_;
        *(undefined8 *)(this->buffer_ + 8) = uVar1;
        this->buffer_end_ = (uint8_t *)local_70;
        this->end_ = this->buffer_ + data._4_4_;
        this_local = (EpsCopyOutputStream *)this->buffer_;
      }
      else {
        puVar3 = this->end_;
        local_70->end_ = *(uint8_t **)puVar3;
        local_70->buffer_end_ = *(uint8_t **)(puVar3 + 8);
        this->end_ = local_70->buffer_ + (long)data._4_4_ + -0x20;
        this->buffer_end_ = (uint8_t *)0x0;
        this_local = local_70;
      }
    }
    return (uint8_t *)this_local;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

uint8_t* EpsCopyOutputStream::Next() {
  ABSL_DCHECK(!had_error_);  // NOLINT
  if (PROTOBUF_PREDICT_FALSE(stream_ == nullptr)) return Error();
  if (buffer_end_) {
    // We're in the patch buffer and need to fill up the previous buffer.
    std::memcpy(buffer_end_, buffer_, end_ - buffer_);
    uint8_t* ptr;
    int size;
    do {
      void* data;
      if (PROTOBUF_PREDICT_FALSE(!stream_->Next(&data, &size))) {
        // Stream has an error, we use the patch buffer to continue to be
        // able to write.
        return Error();
      }
      ptr = static_cast<uint8_t*>(data);
    } while (size == 0);
    if (PROTOBUF_PREDICT_TRUE(size > kSlopBytes)) {
      std::memcpy(ptr, end_, kSlopBytes);
      end_ = ptr + size - kSlopBytes;
      buffer_end_ = nullptr;
      return ptr;
    } else {
      ABSL_DCHECK(size > 0);  // NOLINT
      // Buffer to small
      std::memmove(buffer_, end_, kSlopBytes);
      buffer_end_ = ptr;
      end_ = buffer_ + size;
      return buffer_;
    }
  } else {
    std::memcpy(buffer_, end_, kSlopBytes);
    buffer_end_ = end_;
    end_ = buffer_ + kSlopBytes;
    return buffer_;
  }
}